

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::BasicReporter::NoAssertionsInTestCase(BasicReporter *this,string *testName)

{
  ostream *poVar1;
  
  startSpansLazily(this);
  poVar1 = (this->m_config).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nNo assertions in test case, \'",0x1e)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(testName->_M_dataplus)._M_p,testName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void NoAssertionsInTestCase( const std::string& testName ) {
            startSpansLazily();
            TextColour colour( TextColour::ResultError );
            m_config.stream << "\nNo assertions in test case, '" << testName << "'\n" << std::endl;
        }